

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

SimpleString __thiscall
JUnitTestOutput::encodeFileName(JUnitTestOutput *this,SimpleString *fileName)

{
  char to;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  long lVar1;
  SimpleString SVar2;
  
  SimpleString::SimpleString((SimpleString *)this,in_RDX);
  to = '/';
  lVar1 = 1;
  do {
    SimpleString::replace((SimpleString *)this,to,'_');
    to = "/\\?%*:|\"<>"[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xb);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString JUnitTestOutput::encodeFileName(const SimpleString& fileName)
{
    // special character list based on: https://en.wikipedia.org/wiki/Filename
    static const char* const forbiddenCharacters = "/\\?%*:|\"<>";

    SimpleString result = fileName;
    for (const char* sym = forbiddenCharacters; *sym; ++sym) {
        result.replace(*sym, '_');
    }
    return result;
}